

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

void Sfm_CheckConsistency(Vec_Wec_t *vFanins,int nPis,int nPos,Vec_Str_t *vFixed)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  int local_30;
  int Fanin;
  int k;
  int i;
  Vec_Int_t *vArray;
  Vec_Str_t *vFixed_local;
  int nPos_local;
  int nPis_local;
  Vec_Wec_t *vFanins_local;
  
  Fanin = 0;
  while( true ) {
    iVar2 = Vec_WecSize(vFanins);
    if (iVar2 <= Fanin) {
      return;
    }
    p = Vec_WecEntry(vFanins,Fanin);
    if ((Fanin < nPis) &&
       ((iVar2 = Vec_IntSize(p), iVar2 != 0 || (cVar1 = Vec_StrEntry(vFixed,Fanin), cVar1 != '\0')))
       ) {
      __assert_fail("Vec_IntSize(vArray) == 0 && Vec_StrEntry(vFixed, i) == (char)0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                    ,0x36,"void Sfm_CheckConsistency(Vec_Wec_t *, int, int, Vec_Str_t *)");
    }
    for (local_30 = 0; iVar2 = Vec_IntSize(p), local_30 < iVar2; local_30 = local_30 + 1) {
      iVar2 = Vec_IntEntry(p,local_30);
      iVar3 = Vec_WecSize(vFanins);
      if (iVar3 <= iVar2 + nPos) {
        __assert_fail("Fanin + nPos < Vec_WecSize(vFanins)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                      ,0x3a,"void Sfm_CheckConsistency(Vec_Wec_t *, int, int, Vec_Str_t *)");
      }
    }
    iVar2 = Vec_WecSize(vFanins);
    if ((iVar2 <= Fanin + nPos) &&
       ((iVar2 = Vec_IntSize(p), iVar2 != 1 || (cVar1 = Vec_StrEntry(vFixed,Fanin), cVar1 != '\0')))
       ) break;
    Fanin = Fanin + 1;
  }
  __assert_fail("Vec_IntSize(vArray) == 1 && Vec_StrEntry(vFixed, i) == (char)0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                ,0x3d,"void Sfm_CheckConsistency(Vec_Wec_t *, int, int, Vec_Str_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Sfm_CheckConsistency( Vec_Wec_t * vFanins, int nPis, int nPos, Vec_Str_t * vFixed )
{
    Vec_Int_t * vArray;
    int i, k, Fanin;
    // check entries
    Vec_WecForEachLevel( vFanins, vArray, i )
    {
        // PIs have no fanins
        if ( i < nPis )
            assert( Vec_IntSize(vArray) == 0 && Vec_StrEntry(vFixed, i) == (char)0 );
        // nodes are in a topo order; POs cannot be fanins
        Vec_IntForEachEntry( vArray, Fanin, k )
//            assert( Fanin < i && Fanin + nPos < Vec_WecSize(vFanins) );
            assert( Fanin + nPos < Vec_WecSize(vFanins) );
        // POs have one fanout
        if ( i + nPos >= Vec_WecSize(vFanins) )
            assert( Vec_IntSize(vArray) == 1 && Vec_StrEntry(vFixed, i) == (char)0 );
    }
}